

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_add_constrain_midnode
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_INT RVar1;
  int iVar2;
  REF_GEOM ref_geom;
  REF_CELL pRVar3;
  REF_INT *pRVar4;
  REF_NODE ref_node;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uVar8;
  char *pcVar9;
  long lVar10;
  double in_XMM0_Qb;
  REF_INT ncell;
  REF_INT cell;
  REF_INT sense;
  REF_CELL local_140;
  REF_NODE local_138;
  REF_BOOL support1;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT face_geom;
  REF_BOOL supported;
  REF_DBL local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  REF_DBL param1 [2];
  REF_DBL param0 [2];
  REF_BOOL support0;
  REF_INT cells [2];
  REF_INT nodes [27];
  
  local_138 = ref_grid->node;
  ref_geom = ref_grid->geom;
  local_118 = node1_weight;
  dStack_110 = in_XMM0_Qb;
  ref_geom_supported(ref_geom,node0,&support0);
  ref_geom_supported(ref_geom,node1,&support1);
  if (support0 == 0) {
    return 0;
  }
  if (support1 == 0) {
    return 0;
  }
  local_108 = 1.0 - local_118;
  dStack_100 = 0.0;
  pRVar3 = ref_grid->cell[0];
  nodes[0] = node0;
  nodes[1] = node1;
  uVar5 = ref_cell_with(pRVar3,nodes,&cell);
  if (uVar5 != 5) {
    if (uVar5 != 0) {
      pcVar9 = "search for edg";
      uVar8 = 0x55a;
      uVar6 = uVar5;
      goto LAB_00190778;
    }
    uVar6 = ref_cell_nodes(pRVar3,cell,nodes);
    if (uVar6 != 0) {
      pcVar9 = "get id";
      uVar8 = 0x55b;
      goto LAB_00190778;
    }
    RVar1 = nodes[pRVar3->node_per];
    uVar6 = ref_geom_cell_tuv(ref_geom,node0,nodes,1,param0,&sense);
    if (uVar6 != 0) {
      pcVar9 = "cell uv";
      uVar8 = 0x55f;
      goto LAB_00190778;
    }
    uVar6 = ref_geom_cell_tuv(ref_geom,node1,nodes,1,param1,&sense);
    if (uVar6 != 0) {
      pcVar9 = "cell uv";
      uVar8 = 0x561;
      goto LAB_00190778;
    }
    local_f8 = param0[0] * local_108 + param1[0] * local_118;
    local_140 = (REF_CELL)CONCAT44(local_140._4_4_,RVar1);
    uVar6 = ref_egads_eval_at(ref_geom,1,RVar1,&local_f8,local_138->real + new_node * 0xf,
                              (REF_DBL *)0x0);
    if (uVar6 != 0) {
      pcVar9 = "eval";
      uVar8 = 0x565;
      goto LAB_00190778;
    }
    uVar6 = ref_geom_add(ref_geom,new_node,1,(REF_INT)local_140,&local_f8);
    if (uVar6 != 0) {
      pcVar9 = "new geom";
      uVar8 = 0x566;
      goto LAB_00190778;
    }
  }
  pRVar3 = ref_grid->cell[3];
  uVar6 = ref_cell_list_with2(pRVar3,node0,node1,2,&ncell,cells);
  if (uVar6 == 0) {
    uVar7 = (ulong)ncell;
    if (uVar7 == 0) {
      return 0;
    }
    if ((ncell != 2) && (ref_geom->manifold != 0)) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x576,
             "ref_geom_add_constrain_midnode","expected two tri for between",2,uVar7);
      ref_geom_tattle(ref_geom,node0);
      ref_geom_tattle(ref_geom,node1);
      ref_node = local_138;
      ref_node_location(local_138,node0);
      ref_node_location(ref_node,node1);
      return 1;
    }
    lVar10 = 0;
    dStack_110 = local_118;
    dStack_100 = local_108;
    local_140 = pRVar3;
    do {
      if ((int)uVar7 <= lVar10) {
        return 0;
      }
      cell = cells[lVar10];
      uVar6 = ref_cell_nodes(local_140,cell,nodes);
      if (uVar6 != 0) {
        pcVar9 = "get id";
        uVar8 = 0x57a;
        goto LAB_00190778;
      }
      uVar6 = ref_geom_tri_supported(ref_geom,nodes,&supported);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x57c,"ref_geom_add_constrain_midnode",(ulong)uVar6,"tri support");
        return uVar6;
      }
      if (supported != 0) {
        RVar1 = nodes[local_140->node_per];
        uVar6 = ref_geom_cell_tuv(ref_geom,node0,nodes,2,param0,&sense);
        if (uVar6 != 0) {
          pcVar9 = "cell uv";
          uVar8 = 0x582;
          goto LAB_00190778;
        }
        uVar6 = ref_geom_cell_tuv(ref_geom,node1,nodes,2,param1,&sense);
        if (uVar6 != 0) {
          pcVar9 = "cell uv";
          uVar8 = 0x584;
          goto LAB_00190778;
        }
        local_f8 = param0[0] * local_108 + param1[0] * local_118;
        dStack_f0 = param0[1] * dStack_100 + param1[1] * dStack_110;
        uVar6 = ref_geom_add(ref_geom,new_node,2,RVar1,&local_f8);
        if (uVar6 != 0) {
          pcVar9 = "new geom";
          uVar8 = 0x588;
          goto LAB_00190778;
        }
        uVar6 = ref_geom_find(ref_geom,new_node,2,RVar1,&face_geom);
        if (uVar6 != 0) {
          pcVar9 = "new face geom";
          uVar8 = 0x58a;
          goto LAB_00190778;
        }
        uVar6 = ref_geom_find(ref_geom,node0,2,RVar1,&geom0);
        if (uVar6 != 0) {
          pcVar9 = "face geom";
          uVar8 = 0x58c;
          goto LAB_00190778;
        }
        uVar6 = ref_geom_find(ref_geom,node1,2,RVar1,&geom1);
        if (uVar6 != 0) {
          pcVar9 = "face geom";
          uVar8 = 0x58d;
          goto LAB_00190778;
        }
        pRVar4 = ref_geom->descr;
        iVar2 = pRVar4[(long)geom0 * 6 + 3];
        if ((iVar2 != 0) && (iVar2 == pRVar4[(long)geom1 * 6 + 3])) {
          pRVar4[(long)face_geom * 6 + 3] = iVar2;
        }
        if ((uVar5 == 5) &&
           (uVar6 = ref_egads_eval_at(ref_geom,2,RVar1,&local_f8,local_138->real + new_node * 0xf,
                                      (REF_DBL *)0x0), uVar6 != 0)) {
          pcVar9 = "eval";
          uVar8 = 0x596;
          goto LAB_00190778;
        }
      }
      lVar10 = lVar10 + 1;
      uVar7 = (ulong)(uint)ncell;
    } while( true );
  }
  pcVar9 = "list";
  uVar8 = 0x56c;
LAB_00190778:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
         "ref_geom_add_constrain_midnode",(ulong)uVar6,pcVar9);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_constrain_midnode(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_DBL node1_weight,
                                                  REF_INT new_node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT type, id;
  REF_DBL param[2], param0[2], param1[2];
  REF_BOOL has_edge_support, supported;
  REF_INT sense, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_STATUS status;
  REF_INT i, ncell, cells[2];
  REF_INT face_geom, geom0, geom1;
  REF_BOOL support0, support1;
  REF_DBL node0_weight = 1.0 - node1_weight;

  RSS(ref_geom_supported(ref_geom, node0, &support0), "node0 supported");
  RSS(ref_geom_supported(ref_geom, node1, &support1), "node1 supported");
  if (!support0 || !support1) {
    return REF_SUCCESS;
  }

  /* insert edge geom on edge cell if present */
  nodes[0] = node0;
  nodes[1] = node1;
  ref_cell = ref_grid_edg(ref_grid);
  status = ref_cell_with(ref_cell, nodes, &cell);
  if (REF_NOT_FOUND == status) {
    has_edge_support = REF_FALSE;
  } else {
    RSS(status, "search for edg");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");
    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_EDGE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    RSS(ref_egads_eval_at(ref_geom, type, id, param,
                          ref_node_xyz_ptr(ref_node, new_node), NULL),
        "eval");
    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    has_edge_support = REF_TRUE;
  }

  /* insert face between */
  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  if (0 == ncell) { /* volume edge */
    return REF_SUCCESS;
  }
  if (ref_geom_manifold(ref_geom)) {
    REIB(2, ncell, "expected two tri for between", {
      ref_geom_tattle(ref_geom, node0);
      ref_geom_tattle(ref_geom, node1);
      ref_node_location(ref_node, node0);
      ref_node_location(ref_node, node1);
    });
  }
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, skip */

    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_FACE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    param[1] = node0_weight * param0[1] + node1_weight * param1[1];

    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    RSS(ref_geom_find(ref_geom, new_node, type, id, &face_geom),
        "new face geom");

    RSS(ref_geom_find(ref_geom, node0, type, id, &geom0), "face geom");
    RSS(ref_geom_find(ref_geom, node1, type, id, &geom1), "face geom");
    if (0 != ref_geom_jump(ref_geom, geom0) &&
        0 != ref_geom_jump(ref_geom, geom1) &&
        ref_geom_jump(ref_geom, geom0) == ref_geom_jump(ref_geom, geom1)) {
      ref_geom_jump(ref_geom, face_geom) = ref_geom_jump(ref_geom, geom0);
    }
    if (!has_edge_support) {
      RSS(ref_egads_eval_at(ref_geom, type, id, param,
                            ref_node_xyz_ptr(ref_node, new_node), NULL),
          "eval");
    }
  }

  return REF_SUCCESS;
}